

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

mg_point_3d * mg_point_3d_copy_ca(mg_point_3d *src,mg_allocator *allocator)

{
  mg_allocator *in_RSI;
  int64_t *in_RDI;
  mg_point_3d *point_3d;
  mg_point_3d *local_8;
  
  if (in_RDI == (int64_t *)0x0) {
    local_8 = (mg_point_3d *)0x0;
  }
  else {
    local_8 = mg_point_3d_alloc(in_RSI);
    if (local_8 == (mg_point_3d *)0x0) {
      local_8 = (mg_point_3d *)0x0;
    }
    else {
      local_8->srid = *in_RDI;
      local_8->x = (double)in_RDI[1];
      local_8->y = (double)in_RDI[2];
      local_8->z = (double)in_RDI[3];
    }
  }
  return local_8;
}

Assistant:

mg_point_3d *mg_point_3d_copy_ca(const mg_point_3d *src,
                                 mg_allocator *allocator) {
  if (!src) {
    return NULL;
  }
  mg_point_3d *point_3d = mg_point_3d_alloc(allocator);
  if (!point_3d) {
    return NULL;
  }
  memcpy(point_3d, src, sizeof(mg_point_3d));
  return point_3d;
}